

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_mul_integer_into(mp_int *r,mp_int *a,uint16_t n)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  size_t i;
  ulong uVar5;
  
  sVar1 = r->nw;
  uVar4 = 0;
  for (uVar5 = 0; auVar3._8_8_ = 0, auVar3._0_8_ = uVar4, sVar1 != uVar5; uVar5 = uVar5 + 1) {
    if (uVar5 < a->nw) {
      uVar4 = a->w[uVar5];
    }
    else {
      uVar4 = 0;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    auVar3 = auVar2 * ZEXT216(n) + auVar3;
    uVar4 = auVar3._8_8_;
    r->w[uVar5] = auVar3._0_8_;
  }
  if (uVar4 == 0) {
    return;
  }
  __assert_fail("!carry",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x360,"void mp_mul_integer_into(mp_int *, mp_int *, uint16_t)");
}

Assistant:

void mp_mul_integer_into(mp_int *r, mp_int *a, uint16_t n)
{
    BignumInt carry = 0, mult = n;
    for (size_t i = 0; i < r->nw; i++) {
        BignumInt aword = mp_word(a, i);
        BignumMULADD(carry, r->w[i], aword, mult, carry);
    }
    assert(!carry);
}